

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O2

token * equality_expression(dmr_C *C,token *token,expression **tree)

{
  uint val;
  token *ptVar1;
  expression *peVar2;
  char *pcVar3;
  expression *peVar4;
  expression *local_48;
  expression *local_40;
  expression *right;
  
  local_48 = (expression *)0x0;
  right = (expression *)tree;
  ptVar1 = relational_expression(C,token,&local_48);
  peVar4 = local_48;
  if (local_48 == (expression *)0x0) {
    peVar4 = (expression *)0x0;
  }
  else {
    while ((SUB84(ptVar1->pos,0) & 0x3f) == 0x11) {
      local_40 = (expression *)0x0;
      val = (ptVar1->field_2).argnum;
      if ((val & 0xfffffffe) != 0x10a) break;
      peVar2 = dmrC_alloc_expression(C,ptVar1->pos,0x16);
      ptVar1 = relational_expression(C,ptVar1->next,&local_40);
      if (local_40 == (expression *)0x0) {
        pcVar3 = dmrC_show_special(C,val);
        dmrC_sparse_error(C,ptVar1->pos,"No right hand side of \'%s\'-expression",pcVar3);
        break;
      }
      peVar2->field_0x1 =
           (byte)((ushort)*(undefined2 *)peVar4 >> 8) & (byte)((ushort)*(undefined2 *)local_40 >> 8)
           & 1;
      peVar2->op = val;
      (peVar2->field_5).field_3.unop = peVar4;
      (peVar2->field_5).field_2.string = (string *)local_40;
      peVar4 = peVar2;
    }
  }
  *(expression **)right = peVar4;
  return ptVar1;
}

Assistant:

static struct token *equality_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C, 
		token, tree, EXPR_COMPARE, relational_expression,
		(op == SPECIAL_EQUAL) || (op == SPECIAL_NOTEQUAL)
	);
}